

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool MatchLabelsAgainstFilterRE
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels,vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *expressions)

{
  bool bVar1;
  reference this;
  char *string;
  string *l;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  RegularExpressionMatch match;
  bool found;
  RegularExpression *re;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *expressions_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels_local;
  
  __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                     (expressions);
  re = (RegularExpression *)
       std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                 (expressions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                *)&re);
    if (!bVar1) {
      return true;
    }
    this = __gnu_cxx::
           __normal_iterator<const_cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
           ::operator*(&__end1);
    match.searchstring._7_1_ = 0;
    cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(labels);
    l = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(labels);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&l), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end2);
      string = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find(this,string,(RegularExpressionMatch *)&__range2);
      if (bVar1) {
        match.searchstring._7_1_ = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((match.searchstring._7_1_ & 1) == 0) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static bool MatchLabelsAgainstFilterRE(
  const std::vector<std::string>& labels,
  const std::vector<cmsys::RegularExpression>& expressions)
{
  for (const auto& re : expressions) {
    // check to see if the label regular expression matches
    bool found = false; // assume it does not match
    cmsys::RegularExpressionMatch match;
    // loop over all labels and look for match
    for (std::string const& l : labels) {
      if (re.find(l.c_str(), match)) {
        found = true;
        break;
      }
    }
    // if no match was found, exclude the test
    if (!found) {
      return false;
    }
  }
  return true;
}